

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binproc.c
# Opt level: O1

void nn_binproc_connect(nn_ins_item *self,nn_ins_item *peer)

{
  nn_sinproc *self_00;
  nn_list_item *it;
  nn_fsm *owner;
  nn_fsm *peer_00;
  
  owner = (nn_fsm *)(self + -3);
  if (self == (nn_ins_item *)0x0) {
    owner = (nn_fsm *)0x0;
  }
  if (*(int *)&owner[1].fn == 2) {
    self_00 = (nn_sinproc *)nn_alloc_(0x290);
    if (self_00 != (nn_sinproc *)0x0) {
      peer_00 = (nn_fsm *)(peer + -3);
      if (peer == (nn_ins_item *)0x0) {
        peer_00 = (nn_fsm *)0x0;
      }
      nn_sinproc_init(self_00,1,(nn_ep *)owner[1].srcptr,owner);
      it = nn_list_end((nn_list *)&owner[1].ctx);
      nn_list_insert((nn_list *)&owner[1].ctx,&self_00->item,it);
      nn_sinproc_connect(self_00,peer_00);
      nn_ep_stat_increment((nn_ep *)owner[1].srcptr,0x66,1);
      return;
    }
  }
  else {
    nn_binproc_connect_cold_1();
  }
  nn_binproc_connect_cold_2();
}

Assistant:

static void nn_binproc_connect (struct nn_ins_item *self,
    struct nn_ins_item *peer)
{
    struct nn_binproc *binproc;
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;

    binproc = nn_cont (self, struct nn_binproc, item);
    cinproc = nn_cont (peer, struct nn_cinproc, item);

    nn_assert_state (binproc, NN_BINPROC_STATE_ACTIVE);

    sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
    alloc_assert (sinproc);
    nn_sinproc_init (sinproc, NN_BINPROC_SRC_SINPROC,
        binproc->item.ep, &binproc->fsm);
    nn_list_insert (&binproc->sinprocs, &sinproc->item,
        nn_list_end (&binproc->sinprocs));
    nn_sinproc_connect (sinproc, &cinproc->fsm);

    nn_ep_stat_increment (binproc->item.ep, NN_STAT_ACCEPTED_CONNECTIONS, 1);
}